

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeBase.hpp
# Opt level: O1

void __thiscall
ft::
treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
::rotateLeft(treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
             *this,node *x)

{
  treeNode<ft::pair<const_int,_int>_> *ptVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> **pptVar3;
  
  ptVar1 = x->right;
  ptVar2 = ptVar1->left;
  x->right = ptVar2;
  if (ptVar2 != (this->m_tree).NIL) {
    ptVar2->parent = x;
  }
  ptVar1->parent = x->parent;
  if (((this->m_tree).m_root == x) ||
     (this = (treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
              *)x->parent, (this->m_tree).m_root == x)) {
    pptVar3 = &(this->m_tree).m_root;
  }
  else {
    if ((this->m_tree).m_first != x) goto LAB_0010b7e3;
    pptVar3 = &(this->m_tree).m_first;
  }
  *pptVar3 = ptVar1;
LAB_0010b7e3:
  ptVar1->left = x;
  x->parent = ptVar1;
  return;
}

Assistant:

void rotateLeft(node* x)
	{
		node*	y = x->right;

		x->right = y->left;
		if (y->left != this->NIL())
			y->left->parent = x;
		y->parent = x->parent;
		if (x == this->root())
			this->m_tree.m_root = y;
		else if (x == x->parent->left)
			x->parent->left = y;
		else if (x == x->parent->right)
			x->parent->right = y;
		y->left = x;
		x->parent = y;
	}